

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

void __thiscall flatbuffers::Parser::ParseMetaData(Parser *this,Definition *def)

{
  bool bVar1;
  Value *this_00;
  string name;
  
  bVar1 = IsNext(this,0x28);
  if (bVar1) {
    while( true ) {
      std::__cxx11::string::string((string *)&name,(string *)&this->attribute_);
      Expect(this,4);
      this_00 = (Value *)operator_new(0x40);
      Value::Value(this_00);
      SymbolTable<flatbuffers::Value>::Add(&def->attributes,&name,this_00);
      bVar1 = IsNext(this,0x3a);
      if (bVar1) {
        ParseSingleValue(this,this_00);
      }
      bVar1 = IsNext(this,0x29);
      if (bVar1) break;
      Expect(this,0x2c);
      std::__cxx11::string::~string((string *)&name);
    }
    std::__cxx11::string::~string((string *)&name);
  }
  return;
}

Assistant:

void Parser::ParseMetaData(Definition &def) {
  if (IsNext('(')) {
    for (;;) {
      auto name = attribute_;
      Expect(kTokenIdentifier);
      auto e = new Value();
      def.attributes.Add(name, e);
      if (IsNext(':')) {
        ParseSingleValue(*e);
      }
      if (IsNext(')')) break;
      Expect(',');
    }
  }
}